

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coded_stream.cc
# Opt level: O3

pair<unsigned_long,_bool> __thiscall
google::protobuf::io::CodedInputStream::ReadVarint64Fallback(CodedInputStream *this)

{
  byte bVar1;
  byte *pbVar2;
  bool bVar3;
  LogMessage *other;
  undefined7 extraout_var;
  size_t offset;
  long lVar4;
  long lVar5;
  byte *pbVar6;
  ulong uVar7;
  pair<unsigned_long,_bool> pVar8;
  uint64_t temp;
  LogFinisher local_51;
  LogMessage local_50;
  
  pbVar2 = this->buffer_;
  pbVar6 = this->buffer_end_;
  if (((int)pbVar6 - (int)pbVar2 < 10) && ((pbVar6 <= pbVar2 || ((char)pbVar6[-1] < '\0')))) {
    bVar3 = ReadVarint64Slow(this,(uint64_t *)&local_50);
    uVar7 = CONCAT71(extraout_var,bVar3) & 0xffffffff;
  }
  else {
    if (-1 < (char)*pbVar2) {
      internal::LogMessage::LogMessage
                (&local_50,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/io/coded_stream.cc"
                 ,0x1a1);
      other = internal::LogMessage::operator<<(&local_50,"CHECK failed: (buffer[0]) >= (128): ");
      internal::LogFinisher::operator=(&local_51,other);
      internal::LogMessage::~LogMessage(&local_50);
    }
    bVar1 = pbVar2[1];
    if ((long)(char)bVar1 < 0) {
      if ((long)(char)pbVar2[2] < 0) {
        if ((long)(char)pbVar2[3] < 0) {
          if ((long)(char)pbVar2[4] < 0) {
            if ((long)(char)pbVar2[5] < 0) {
              if ((long)(char)pbVar2[6] < 0) {
                if ((long)(char)pbVar2[7] < 0) {
                  if ((long)(char)pbVar2[8] < 0) {
                    if ((long)(char)pbVar2[9] < 0) {
                      local_50._0_8_ = 0;
                      uVar7 = 0;
                      goto LAB_0031ac05;
                    }
                    local_50._0_8_ = (long)(char)pbVar2[9] << 0x3f;
                    lVar4 = 0;
                    pbVar6 = pbVar2;
                    do {
                      local_50._0_8_ =
                           local_50._0_8_ + ((ulong)*pbVar6 - 0x80 << ((byte)lVar4 & 0x3f));
                      lVar4 = lVar4 + 7;
                      pbVar6 = pbVar6 + 1;
                      lVar5 = 10;
                    } while (lVar4 != 0x3f);
                  }
                  else {
                    local_50._0_8_ = (long)(char)pbVar2[8] << 0x38;
                    lVar4 = 0;
                    pbVar6 = pbVar2;
                    do {
                      local_50._0_8_ =
                           local_50._0_8_ + ((ulong)*pbVar6 - 0x80 << ((byte)lVar4 & 0x3f));
                      lVar4 = lVar4 + 7;
                      pbVar6 = pbVar6 + 1;
                      lVar5 = 9;
                    } while (lVar4 != 0x38);
                  }
                }
                else {
                  local_50._0_8_ = (long)(char)pbVar2[7] << 0x31;
                  lVar4 = 0;
                  pbVar6 = pbVar2;
                  do {
                    local_50._0_8_ =
                         local_50._0_8_ + ((ulong)*pbVar6 - 0x80 << ((byte)lVar4 & 0x3f));
                    lVar4 = lVar4 + 7;
                    pbVar6 = pbVar6 + 1;
                    lVar5 = 8;
                  } while (lVar4 != 0x31);
                }
              }
              else {
                local_50._0_8_ = (long)(char)pbVar2[6] << 0x2a;
                lVar4 = 0;
                pbVar6 = pbVar2;
                do {
                  local_50._0_8_ = local_50._0_8_ + ((ulong)*pbVar6 - 0x80 << ((byte)lVar4 & 0x3f));
                  lVar4 = lVar4 + 7;
                  pbVar6 = pbVar6 + 1;
                  lVar5 = 7;
                } while (lVar4 != 0x2a);
              }
            }
            else {
              local_50._0_8_ = (long)(char)pbVar2[5] << 0x23;
              lVar4 = 0;
              pbVar6 = pbVar2;
              do {
                local_50._0_8_ = local_50._0_8_ + ((ulong)*pbVar6 - 0x80 << ((byte)lVar4 & 0x3f));
                lVar4 = lVar4 + 7;
                pbVar6 = pbVar6 + 1;
                lVar5 = 6;
              } while (lVar4 != 0x23);
            }
          }
          else {
            local_50._0_8_ = (long)(char)pbVar2[4] << 0x1c;
            lVar4 = 0;
            pbVar6 = pbVar2;
            do {
              local_50._0_8_ = local_50._0_8_ + ((ulong)*pbVar6 - 0x80 << ((byte)lVar4 & 0x3f));
              lVar4 = lVar4 + 7;
              pbVar6 = pbVar6 + 1;
            } while (lVar4 != 0x1c);
            lVar5 = 5;
          }
        }
        else {
          local_50._0_8_ = (long)(char)pbVar2[3] << 0x15;
          lVar4 = 0;
          pbVar6 = pbVar2;
          do {
            local_50._0_8_ = local_50._0_8_ + ((ulong)*pbVar6 - 0x80 << ((byte)lVar4 & 0x3f));
            lVar4 = lVar4 + 7;
            pbVar6 = pbVar6 + 1;
          } while (lVar4 != 0x15);
          lVar5 = 4;
        }
      }
      else {
        local_50._0_8_ =
             ((ulong)bVar1 * 0x80 + (long)(char)pbVar2[2] * 0x4000 + (ulong)*pbVar2) - 0x4080;
        lVar5 = 3;
      }
    }
    else {
      local_50._0_8_ = ((long)(char)bVar1 * 0x80 + (ulong)*pbVar2) - 0x80;
      lVar5 = 2;
    }
    this->buffer_ = pbVar2 + lVar5;
    uVar7 = 1;
  }
LAB_0031ac05:
  pVar8._8_8_ = uVar7;
  pVar8.first = local_50._0_8_;
  return pVar8;
}

Assistant:

std::pair<uint64_t, bool> CodedInputStream::ReadVarint64Fallback() {
  if (BufferSize() >= kMaxVarintBytes ||
      // Optimization:  We're also safe if the buffer is non-empty and it ends
      // with a byte that would terminate a varint.
      (buffer_end_ > buffer_ && !(buffer_end_[-1] & 0x80))) {
    uint64_t temp;
    ::std::pair<bool, const uint8_t*> p = ReadVarint64FromArray(buffer_, &temp);
    if (!p.first) {
      return std::make_pair(0, false);
    }
    buffer_ = p.second;
    return std::make_pair(temp, true);
  } else {
    uint64_t temp;
    bool success = ReadVarint64Slow(&temp);
    return std::make_pair(temp, success);
  }
}